

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::getDualsSingletonRow(HPresolve *this,int row,int col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer piVar10;
  int iVar11;
  _Elt_pointer pdVar12;
  ulong uVar13;
  pointer pdVar14;
  ostream *poVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  _Elt_pointer ppVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  pair<int,_std::vector<double,_std::allocator<double>_>_> bnd;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_78;
  vector<double,_std::allocator<double>_> local_48;
  
  ppVar22 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar22 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar22 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&ppVar22[-1].second);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&(this->super_HPreData).oldBounds.c);
  uVar20 = (ulong)row;
  pdVar14 = (this->super_HPreData).valueRowDual.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_HPreData).valueRowDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar20) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
  }
  pdVar14[uVar20] = 0.0;
  pdVar12 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar12 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    pdVar12 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).postValue.c.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  dVar1 = pdVar12[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&(this->super_HPreData).postValue.c);
  dVar27 = HPreData::getaij(&this->super_HPreData,row,col);
  uVar26 = (ulong)col;
  pdVar14 = (this->super_HPreData).valuePrimal.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar18 = uVar26;
  if ((ulong)((long)(this->super_HPreData).valuePrimal.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
  goto LAB_001487a1;
  dVar30 = *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar29 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  dVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[2];
  dVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3];
  dVar32 = pdVar14[uVar26];
  dVar31 = this->tol;
  if ((dVar27 * dVar32 - dVar2 <= dVar31) || (dVar3 - dVar27 * dVar32 <= dVar31)) {
    if ((dVar32 <= dVar30) || (dVar29 <= dVar32)) {
LAB_00147e9e:
      if ((dVar32 == dVar30) && (dVar32 < dVar29)) {
        pdVar14 = (this->super_HPreData).valueColDual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valueColDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
        goto LAB_001487a1;
        if (pdVar14[uVar26] <= -dVar31 && -dVar31 != pdVar14[uVar26]) goto LAB_00147f16;
      }
      if ((dVar32 == dVar29) && (dVar30 < dVar32)) {
        pdVar14 = (this->super_HPreData).valueColDual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valueColDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
        goto LAB_001487a1;
        if (dVar31 < pdVar14[uVar26]) goto LAB_00147f16;
      }
    }
    else {
      pdVar14 = (this->super_HPreData).valueColDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if ((ulong)((long)(this->super_HPreData).valueColDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
      goto LAB_001487a1;
      if (ABS(pdVar14[uVar26]) <= dVar31) goto LAB_00147e9e;
LAB_00147f16:
      pdVar14[uVar26] = 0.0;
    }
    piVar10 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar18 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
    uVar16 = uVar26;
    if (uVar18 <= uVar26) {
LAB_0014875e:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16,
                 uVar18);
    }
    piVar8 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
    if (uVar18 <= uVar26) goto LAB_0014875e;
    iVar6 = piVar10[uVar26];
    uVar17 = (ulong)iVar6;
    iVar7 = piVar8[uVar26];
    piVar10 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
    piVar8 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
    uVar23 = uVar17;
    if (uVar17 < uVar19) {
      uVar23 = uVar19;
    }
    dVar31 = 0.0;
    iVar11 = iVar7;
    if (iVar7 < iVar6) {
      iVar11 = iVar6;
    }
    if (iVar6 < iVar7) {
      pdVar14 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar24 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar14 >> 3;
      pdVar9 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar25 = (long)(this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
      do {
        uVar18 = uVar19;
        uVar16 = uVar23;
        if ((uVar19 <= uVar17) ||
           (uVar21 = (ulong)piVar10[uVar17], uVar18 = uVar13, uVar16 = uVar21, uVar13 <= uVar21))
        goto LAB_0014875e;
        if (piVar8[uVar21] != 0) {
          uVar18 = uVar24;
          if ((uVar24 <= uVar21) || (uVar18 = uVar25, uVar16 = uVar17, uVar25 <= uVar17))
          goto LAB_0014875e;
          dVar31 = dVar31 + pdVar14[uVar21] * pdVar9[uVar17];
        }
        uVar17 = uVar17 + 1;
      } while ((long)iVar11 != uVar17);
    }
    if (uVar13 <= uVar20) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20,
                 uVar13);
    }
    piVar8[uVar20] = 1;
    pdVar14 = (this->super_HPreData).valueColDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    uVar18 = uVar26;
    if ((ulong)((long)(this->super_HPreData).valueColDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
    goto LAB_001487eb;
    dVar32 = ((pdVar14[uVar26] - dVar1) - dVar31) / dVar27;
    if ((dVar32 != 0.0) || (NAN(dVar32))) {
      if (this->iKKTcheck == 1) {
        KktChStep::addCost(&(this->super_HPreData).chk,col,dVar1);
      }
      if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
        pdVar14 = (this->super_HPreData).valuePrimal.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valuePrimal.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
        goto LAB_001487eb;
        dVar4 = pdVar14[uVar26];
        dVar28 = dVar27 * dVar4;
        dVar5 = this->tol;
        if ((((dVar28 == dVar2) && (!NAN(dVar28) && !NAN(dVar2))) && (dVar5 < dVar32)) ||
           (((dVar28 == dVar3 && (!NAN(dVar28) && !NAN(dVar3))) && (dVar32 < -dVar5)))) {
          local_78 = (double)(-(ulong)(dVar5 < dVar32) & 0xe974e718d7d7625a);
          local_b0 = 0.0;
          local_a8 = 1e+200;
          local_a0 = 0.0;
          if (dVar32 <= dVar5) {
            local_a0 = 1e+200;
          }
          if ((dVar4 != dVar30) || (dVar29 <= dVar30)) {
            local_b0 = -1e+200;
            if ((dVar4 != dVar29) || (dVar29 <= dVar30)) {
              if ((dVar30 != dVar29) || (NAN(dVar30) || NAN(dVar29))) goto LAB_001482ea;
              local_b0 = 0.0;
            }
            local_a8 = 0.0;
          }
LAB_001482ea:
          if (dVar27 <= 0.0) {
            if (dVar27 < 0.0) {
              if ((-1e+200 < local_78) &&
                 (dVar30 = dVar27 * local_78 + dVar1 + dVar31, dVar30 < local_a8)) {
                local_a8 = dVar30;
              }
              if ((dVar5 < dVar32) && (dVar30 = dVar27 * 0.0 + dVar1 + dVar31, local_b0 < dVar30)) {
                local_b0 = dVar30;
              }
              if ((-1e+200 < local_b0) &&
                 (dVar30 = ((local_b0 - dVar31) - dVar1) / dVar27, dVar30 < local_a0)) {
                local_a0 = dVar30;
              }
              if ((local_a8 < 1e+200) &&
                 (dVar30 = ((local_b0 - dVar31) - dVar1) / dVar27, local_78 < dVar30)) {
                local_78 = dVar30;
              }
            }
          }
          else {
            if ((-1e+200 < local_78) &&
               (dVar30 = dVar27 * local_78 + dVar1 + dVar31, local_b0 < dVar30)) {
              local_b0 = dVar30;
            }
            if ((dVar5 < dVar32) && (dVar30 = dVar27 * 0.0 + dVar1 + dVar31, dVar30 < local_a8)) {
              local_a8 = dVar30;
            }
            if ((-1e+200 < local_b0) &&
               (dVar30 = ((local_b0 - dVar31) - dVar1) / dVar27, local_78 < dVar30)) {
              local_78 = dVar30;
            }
            if ((local_a8 < 1e+200) &&
               (dVar30 = ((local_a8 - dVar31) - dVar1) / dVar27, dVar30 < local_a0)) {
              local_a0 = dVar30;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"loY= ",5);
          poVar15 = std::ostream::_M_insert<double>(local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," upY= ",6);
          poVar15 = std::ostream::_M_insert<double>(local_a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"loZ= ",5);
          poVar15 = std::ostream::_M_insert<double>(local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," upZ= ",6);
          poVar15 = std::ostream::_M_insert<double>(local_a8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          pdVar14 = (this->super_HPreData).valueRowDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar18 = (long)(this->super_HPreData).valueRowDual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar14 >> 3;
          if (uVar18 <= uVar20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar20);
          }
          pdVar14[uVar20] = 0.0;
          piVar10 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar16 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
          uVar23 = uVar26;
          if (uVar16 <= uVar26) {
LAB_0014878a:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar23,uVar16);
          }
          piVar8 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar16 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
          if (uVar16 <= uVar26) goto LAB_0014878a;
          iVar6 = piVar10[uVar26];
          uVar19 = (ulong)iVar6;
          iVar7 = piVar8[uVar26];
          piVar10 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar17 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
          uVar13 = uVar19;
          if (uVar19 < uVar17) {
            uVar13 = uVar17;
          }
          dVar30 = 0.0;
          iVar11 = iVar7;
          if (iVar7 < iVar6) {
            iVar11 = iVar6;
          }
          if (iVar6 < iVar7) {
            piVar8 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar24 = (long)(this->super_HPreData).flagRow.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
            pdVar9 = (this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar25 = (long)(this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
            do {
              uVar16 = uVar17;
              uVar23 = uVar13;
              if ((uVar17 <= uVar19) ||
                 (uVar21 = (ulong)piVar10[uVar19], uVar16 = uVar24, uVar23 = uVar21,
                 uVar24 <= uVar21)) goto LAB_0014878a;
              if (piVar8[uVar21] != 0) {
                uVar16 = uVar18;
                if ((uVar18 <= uVar21) || (uVar16 = uVar25, uVar23 = uVar19, uVar25 <= uVar19))
                goto LAB_0014878a;
                dVar30 = dVar30 + pdVar14[uVar21] * pdVar9[uVar19];
              }
              uVar19 = uVar19 + 1;
            } while ((long)iVar11 != uVar19);
          }
          pdVar9 = (this->super_HPreData).valueColDual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).valueColDual.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar26) {
LAB_001487d7:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar26);
          }
          dVar29 = dVar1 + dVar30;
          if (((0.0 < pdVar9[uVar26]) && (dVar29 < 0.0)) ||
             ((pdVar9[uVar26] < 0.0 && (0.0 < dVar29)))) {
            pdVar14[uVar20] = (-dVar1 - dVar30) / dVar27;
            pdVar9[uVar26] = 0.0;
            if (this->iKKTcheck == 1) {
              pdVar14 = (this->super_HPreData).valuePrimal.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->super_HPreData).valuePrimal.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
              goto LAB_001487d7;
              KktChStep::addChange(&(this->super_HPreData).chk,2,0,col,pdVar14[uVar26],0.0,dVar1);
            }
          }
          else {
            pdVar9[uVar26] = dVar29;
          }
          goto LAB_001482b1;
        }
      }
      pdVar14 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar18 = uVar20;
      if ((ulong)((long)(this->super_HPreData).valueRowDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar20) {
LAB_001487eb:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar18);
      }
      goto LAB_001481fb;
    }
  }
  else {
    pdVar14 = (this->super_HPreData).valueRowDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    dVar32 = 0.0;
    uVar18 = uVar20;
    if ((ulong)((long)(this->super_HPreData).valueRowDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar20)
    goto LAB_001487a1;
LAB_001481fb:
    pdVar14[uVar20] = dVar32;
  }
  piVar10 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar18 = uVar20;
  if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <= uVar20) {
LAB_001487a1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18);
  }
  piVar10[uVar20] = 1;
  piVar10 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar18 = uVar26;
  if ((ulong)((long)(this->super_HPreData).nonbasicFlag.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)piVar10 >> 2) <= uVar26) goto LAB_001487a1;
  if (piVar10[uVar26] != 0) {
    if (piVar10[uVar26] != 1) goto LAB_001482b1;
    pdVar14 = (this->super_HPreData).valuePrimal.super__Vector_base<double,_std::allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).valuePrimal.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar14 >> 3) <= uVar26)
    goto LAB_001487a1;
    dVar1 = pdVar14[uVar26];
    if ((dVar1 != dVar30) || (NAN(dVar1) || NAN(dVar30))) {
      if ((dVar1 != dVar29) || (NAN(dVar1) || NAN(dVar29))) {
        piVar10[uVar26] = 0;
        piVar10[(long)row + (long)(this->super_HPreData).numColOriginal] = 1;
        goto LAB_001482b1;
      }
    }
  }
  piVar10[(long)row + (long)(this->super_HPreData).numColOriginal] = 0;
LAB_001482b1:
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::getDualsSingletonRow( int row, int col ) {

	pair< int ,vector<double> > bnd = oldBounds.top(); oldBounds.pop();

	valueRowDual.at(row) = 0;
	double cost = postValue.top(); postValue.pop();
	double aij = getaij(row, col);
	double l = (get<1>(bnd))[0];
	double u = (get<1>(bnd))[1];
	double lrow = (get<1>(bnd))[2];
	double urow = (get<1>(bnd))[3];
	if ((aij*valuePrimal.at(col) - lrow) > tol && ( -aij*valuePrimal.at(col) + urow) > tol) {
		valueRowDual.at(row) = 0;
		//row is nonbasic

	}
	else {
		if  ((valuePrimal.at(col) > l && valuePrimal.at(col) < u && abs(valueColDual.at(col)) > tol ) ||
				(valuePrimal.at(col) == l && valuePrimal.at(col) < u && valueColDual.at(col) < -tol ) ||
				(valuePrimal.at(col) == u && valuePrimal.at(col) > l && valueColDual.at(col) > tol )) {

			valueColDual.at(col) = 0;
		}

		double sum = 0;
		for (int k=Astart.at(col); k<Aend.at(col);++k )
			if (flagRow.at(Aindex.at(k)))
				sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);

		flagRow.at(row) = 1;


		double y = (valueColDual.at(col) - cost - sum)/aij;
		if (y != 0) {
			if (iKKTcheck == 1)
				chk.addCost(col, cost);

			//aij * yi + sum + ci = zi
			if (urow != lrow)
				if  ((aij*valuePrimal.at(col) == lrow && y >  tol) ||
					(aij*valuePrimal.at(col) == urow && y < -tol)) {


					//bounds on y_row
					double loY = -HSOL_CONST_INF;
					double upY = HSOL_CONST_INF;

					if (y>tol)
						upY = 0;
					else //y < -tol
						loY = 0;

					//bounds on z_col
					double loZ = -HSOL_CONST_INF;
					double upZ = HSOL_CONST_INF;
					if  (valuePrimal.at(col) == l && l < u ) {
						loZ = 0;
					}
					else if (valuePrimal.at(col) == u && l < u) {
						upZ = 0;
					}
					else if (l==u) {
						loZ = 0;
						upZ = 0;
					}
					//aij * yi + sum + ci = zi

					double lo = -HSOL_CONST_INF;
					double up = HSOL_CONST_INF;
					//bounds on z by y
					if (aij > 0) {
						if (loY >  -HSOL_CONST_INF) {
							lo = sum + cost + aij * loY;
							if (lo>loZ)
								loZ = lo;
						}
						if (upY < HSOL_CONST_INF) {
							up = sum + cost + aij * upY;
							if (up<upZ)
								upZ = up;
						}
					}
					else if (aij < 0) {
						if (loY >  -HSOL_CONST_INF) {
							up = sum + cost + aij * loY;
							if (up<upZ)
								upZ = up;
						}
						if (upY < HSOL_CONST_INF) {
							lo = sum + cost + aij * upY;
							if (lo>loZ)
								loZ = lo;
						}
					}
					//bounds on y by z
					//aij * yi  = zi - sum - ci
					if (aij > 0) {
						if (loZ >  -HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
						if (upZ < HSOL_CONST_INF) {
							up = (upZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
					}
					else if (aij < 0) {
						if (loZ >  -HSOL_CONST_INF) {
							up = (loZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
						if (upZ < HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
					}

					cout<< "loY= "<< loY <<" upY= "<<upY<<"loZ= "<< loZ <<" upZ= "<<upZ<<endl;

					valueRowDual.at(row) = 0;

					sum = 0;
					for (int k=Astart.at(col); k<Aend.at(col);++k )
						if (flagRow.at(Aindex.at(k))) {
							sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
							//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
						}
					double newz = cost + sum;
					if ((valueColDual.at(col) > 0 && newz < 0) ||
						(valueColDual.at(col) < 0 && newz > 0)) {
						//valueColDual.at(col) = 0;
						//update valueRowDual.at(row)
						//newz = 0 if cost + sum + aijyi = 0 so aijyi = - cost - sum

						valueRowDual.at(row) = (-cost - sum)/aij;
						valueColDual.at(col) = 0;
						if (iKKTcheck == 1) {
							chk.addChange(2, 0, col, valuePrimal.at(col), valueColDual.at(col), cost);
						}
						return;

					}

					valueColDual.at(col) = newz;
					return;
				}
		valueRowDual.at(row) = y;
		}
	}

	flagRow.at(row) = 1;
	//row is introduced so something needs to become basic :



	//check if x is at a bound forced by the singleton row: then x becomes basic and row nonbasic
	if (nonbasicFlag.at(col) == 1) {
		// x was not basic but is now
		if (valuePrimal.at(col)  != l && valuePrimal.at(col) != u ) {
			nonbasicFlag.at(col) = 0;
			nonbasicFlag[numColOriginal + row] = 1;
		}
		// x was not basic and is not now either, row is basic
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}
	else if (nonbasicFlag.at(col) == 0)  // x is basic
		nonbasicFlag[numColOriginal + row] = 0; //row becomes basic too

}